

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O0

void __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>::
Direct_Lower_Upper_Factorisation
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this,
          Solver_Config config)

{
  Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this_local;
  
  Direct<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>,_0UL>::Direct
            ((Direct<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>,_0UL> *
             )this,config);
  this->factorised = false;
  this->factorisation_tolerance = 1.4210854715202004e-14;
  Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense(&this->lu_factorised);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->pivots);
  initialise_solver(this,config);
  return;
}

Assistant:

explicit Direct_Lower_Upper_Factorisation(Solver_Config config)
      : Direct<Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>, _size>(config) {
    initialise_solver(config);
  }